

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O3

int run_test_tcp_bind_error_inval(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  char *pcVar3;
  sockaddr_in addr2;
  sockaddr_in addr1;
  uv_tcp_t server;
  undefined1 auStack_690 [16];
  undefined1 auStack_680 [16];
  char acStack_670 [248];
  char acStack_578 [80];
  char acStack_528 [192];
  code *pcStack_468;
  undefined1 auStack_458 [248];
  code *pcStack_360;
  undefined1 auStack_350 [16];
  undefined1 auStack_340 [248];
  code *pcStack_248;
  undefined1 auStack_238 [16];
  undefined1 auStack_228 [248];
  code *pcStack_130;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [248];
  
  pcStack_130 = (code *)0x170451;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_110);
  if (iVar1 == 0) {
    pcStack_130 = (code *)0x17046f;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,local_120);
    if (iVar1 != 0) goto LAB_0017052d;
    pcStack_130 = (code *)0x17047c;
    uVar2 = uv_default_loop();
    pcStack_130 = (code *)0x170489;
    iVar1 = uv_tcp_init(uVar2,local_100);
    if (iVar1 != 0) goto LAB_00170532;
    pcStack_130 = (code *)0x1704a2;
    iVar1 = uv_tcp_bind(local_100,local_110,0);
    if (iVar1 != 0) goto LAB_00170537;
    pcStack_130 = (code *)0x1704bb;
    iVar1 = uv_tcp_bind(local_100,local_120,0);
    if (iVar1 != -0x16) goto LAB_0017053c;
    pcStack_130 = (code *)0x1704d1;
    uv_close(local_100,close_cb);
    pcStack_130 = (code *)0x1704d6;
    uVar2 = uv_default_loop();
    pcStack_130 = (code *)0x1704e0;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_00170541;
    pcStack_130 = (code *)0x1704ee;
    unaff_RBX = uv_default_loop();
    pcStack_130 = (code *)0x170502;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_130 = (code *)0x17050c;
    uv_run(unaff_RBX,0);
    pcStack_130 = (code *)0x170511;
    uVar2 = uv_default_loop();
    pcStack_130 = (code *)0x170519;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_130 = (code *)0x17052d;
    run_test_tcp_bind_error_inval_cold_1();
LAB_0017052d:
    pcStack_130 = (code *)0x170532;
    run_test_tcp_bind_error_inval_cold_2();
LAB_00170532:
    pcStack_130 = (code *)0x170537;
    run_test_tcp_bind_error_inval_cold_3();
LAB_00170537:
    pcStack_130 = (code *)0x17053c;
    run_test_tcp_bind_error_inval_cold_4();
LAB_0017053c:
    pcStack_130 = (code *)0x170541;
    run_test_tcp_bind_error_inval_cold_5();
LAB_00170541:
    pcStack_130 = (code *)0x170546;
    run_test_tcp_bind_error_inval_cold_6();
  }
  pcStack_130 = run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  pcStack_248 = (code *)0x170569;
  pcStack_130 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_238);
  if (iVar1 == 0) {
    pcStack_248 = (code *)0x170572;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x17057f;
    iVar1 = uv_tcp_init(uVar2,auStack_228);
    if (iVar1 != 0) goto LAB_001705dc;
    pcStack_248 = (code *)0x170594;
    iVar1 = uv_tcp_bind(auStack_228,auStack_238,0);
    if (iVar1 != 0) goto LAB_001705e1;
    pcStack_248 = (code *)0x17059d;
    unaff_RBX = uv_default_loop();
    pcStack_248 = (code *)0x1705b1;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_248 = (code *)0x1705bb;
    uv_run(unaff_RBX,0);
    pcStack_248 = (code *)0x1705c0;
    uVar2 = uv_default_loop();
    pcStack_248 = (code *)0x1705c8;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_248 = (code *)0x1705dc;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_001705dc:
    pcStack_248 = (code *)0x1705e1;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_001705e1:
    pcStack_248 = (code *)0x1705e6;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  pcStack_248 = run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  pcStack_360 = (code *)0x170609;
  pcStack_248 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_350);
  if (iVar1 == 0) {
    pcStack_360 = (code *)0x170612;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x17061f;
    iVar1 = uv_tcp_init(uVar2,auStack_340);
    if (iVar1 != 0) goto LAB_00170680;
    pcStack_360 = (code *)0x170637;
    iVar1 = uv_tcp_bind(auStack_340,auStack_350,1);
    if (iVar1 != -0x16) goto LAB_00170685;
    pcStack_360 = (code *)0x170641;
    unaff_RBX = uv_default_loop();
    pcStack_360 = (code *)0x170655;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_360 = (code *)0x17065f;
    uv_run(unaff_RBX,0);
    pcStack_360 = (code *)0x170664;
    uVar2 = uv_default_loop();
    pcStack_360 = (code *)0x17066c;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_360 = (code *)0x170680;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_00170680:
    pcStack_360 = (code *)0x170685;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_00170685:
    pcStack_360 = (code *)0x17068a;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_360 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_468 = (code *)0x17069c;
  pcStack_360 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_468 = (code *)0x1706a9;
  iVar1 = uv_tcp_init(uVar2,auStack_458);
  if (iVar1 == 0) {
    pcStack_468 = (code *)0x1706be;
    iVar1 = uv_listen(auStack_458,0x80,0);
    if (iVar1 != 0) goto LAB_00170706;
    pcStack_468 = (code *)0x1706c7;
    unaff_RBX = uv_default_loop();
    pcStack_468 = (code *)0x1706db;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_468 = (code *)0x1706e5;
    uv_run(unaff_RBX,0);
    pcStack_468 = (code *)0x1706ea;
    uVar2 = uv_default_loop();
    pcStack_468 = (code *)0x1706f2;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_468 = (code *)0x170706;
    run_test_tcp_listen_without_bind_cold_1();
LAB_00170706:
    pcStack_468 = (code *)0x17070b;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_468 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcVar3 = "0.0.0.0";
  pcStack_468 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_690);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_tcp_init(pcVar3,acStack_670);
    if (iVar1 != 0) goto LAB_0017088a;
    pcVar3 = acStack_670;
    iVar1 = uv_tcp_bind(pcVar3,auStack_690,0);
    if (iVar1 != 0) goto LAB_0017088f;
    pcVar3 = acStack_670;
    iVar1 = uv_listen(pcVar3,0x80,0);
    if (iVar1 != 0) goto LAB_00170894;
    pcVar3 = acStack_670;
    iVar1 = uv_is_writable(pcVar3);
    if (iVar1 != 0) goto LAB_00170899;
    pcVar3 = acStack_670;
    iVar1 = uv_is_readable(pcVar3);
    if (iVar1 != 0) goto LAB_0017089e;
    auStack_680 = uv_buf_init("PING",4);
    pcVar3 = acStack_528;
    iVar1 = uv_write(pcVar3,acStack_670,auStack_680,1,0);
    if (iVar1 != -0x20) goto LAB_001708a3;
    pcVar3 = acStack_578;
    iVar1 = uv_shutdown(pcVar3,acStack_670,0);
    if (iVar1 != -0x6b) goto LAB_001708a8;
    pcVar3 = acStack_670;
    iVar1 = uv_read_start(pcVar3,0,0);
    if (iVar1 != -0x6b) goto LAB_001708ad;
    uv_close(acStack_670,close_cb);
    pcVar3 = (char *)uv_default_loop();
    uv_run(pcVar3,0);
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001708b7;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0017088a:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0017088f:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_00170894:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_00170899:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0017089e:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001708a3:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001708a8:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001708ad:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_001708b7:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_error_inval) {
  struct sockaddr_in addr1;
  struct sockaddr_in addr2;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr1));
  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT_2, &addr2));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr1, 0);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr2, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}